

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqlite_vm_reset(unqlite_vm *pVm)

{
  uint uVar1;
  jx9_vm *pjVar2;
  int iVar3;
  
  iVar3 = -0x18;
  if ((pVm != (unqlite_vm *)0x0) && (pVm->nMagic != 0xdead2bad)) {
    pjVar2 = pVm->pJx9Vm;
    if ((pjVar2->nMagic == 0xcdfe1dad) || (pjVar2->nMagic == 0xba851227)) {
      (pjVar2->sConsumer).nByte = 0;
      uVar1 = (pjVar2->sConsumer).nFlags;
      if ((uVar1 & 4) != 0) {
        (pjVar2->sConsumer).pBlob = (void *)0x0;
        (pjVar2->sConsumer).mByte = 0;
        (pjVar2->sConsumer).nFlags = uVar1 & 0xfffffffb;
      }
      jx9MemObjRelease(&pjVar2->sExec);
      pjVar2->nMagic = 0xba851227;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int unqlite_vm_reset(unqlite_vm *pVm)
{
	int rc;
	if( UNQLITE_VM_MISUSE(pVm) ){
		return UNQLITE_CORRUPT;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Acquire VM mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, pVm->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
	 if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE && 
		 UNQLITE_THRD_VM_RELEASE(pVm) ){
			 return UNQLITE_ABORT; /* Another thread have released this instance */
	 }
#endif
	/* Reset the Jx9 VM */
	 rc = jx9VmReset(pVm->pJx9Vm);
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Leave DB mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods,pVm->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
#endif
	return rc;
}